

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

PortExpressionSyntax * __thiscall slang::parsing::Parser::parsePortExpression(Parser *this)

{
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  Token closeBrace_00;
  Token openBrace_00;
  bool bVar1;
  Info *pIVar2;
  long in_RDI;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> items;
  Token closeBrace;
  Token openBrace;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *in_stack_00000140;
  Token *in_stack_00000148;
  TokenKind in_stack_00000152;
  TokenKind in_stack_00000154;
  TokenKind in_stack_00000156;
  ParserBase *in_stack_00000158;
  Token *in_stack_00000170;
  RequireItems in_stack_00000178;
  DiagCode in_stack_00000180;
  anon_class_8_1_8991fb9c *in_stack_00000188;
  AllowEmpty in_stack_00000190;
  SeparatedSyntaxList<slang::syntax::PortReferenceSyntax> *references;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 uVar4;
  undefined2 in_stack_ffffffffffffff1c;
  TokenKind in_stack_ffffffffffffff1e;
  ParserBase *in_stack_ffffffffffffff20;
  __extent_storage<18446744073709551615UL> _Var5;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffff2c;
  Parser *in_stack_ffffffffffffff30;
  undefined1 local_58 [12];
  undefined4 local_4c;
  PortConcatenationSyntax *local_10;
  
  bVar1 = ParserBase::peek(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1e);
  if (bVar1) {
    Token::Token((Token *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    Token::Token((Token *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    std::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::span
              ((span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)0xa0abf7);
    local_4c = 0x10001;
    references = (SeparatedSyntaxList<slang::syntax::PortReferenceSyntax> *)&stack0xffffffffffffffc8
    ;
    _Var5._M_extent_value = (size_t)local_58;
    uVar3 = 1;
    uVar4 = 0x10001;
    uVar6 = 0;
    ParserBase::
    parseList<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isEndOfBracedList,slang::parsing::Parser::parsePortExpression()::__0>
              (in_stack_00000158,in_stack_00000156,in_stack_00000154,in_stack_00000152,
               in_stack_00000148,in_stack_00000140,in_stack_00000170,in_stack_00000178,
               in_stack_00000180,in_stack_00000188,in_stack_00000190);
    pIVar2 = (Info *)(in_RDI + 0xe0);
    elements._M_ptr._4_2_ = in_stack_ffffffffffffff1c;
    elements._M_ptr._0_4_ = uVar4;
    elements._M_ptr._6_2_ = in_stack_ffffffffffffff1e;
    elements._M_extent._M_extent_value = _Var5._M_extent_value;
    slang::syntax::SeparatedSyntaxList<slang::syntax::PortReferenceSyntax>::SeparatedSyntaxList
              ((SeparatedSyntaxList<slang::syntax::PortReferenceSyntax> *)
               CONCAT44(in_stack_ffffffffffffff14,uVar3),elements);
    openBrace_00.rawLen = in_stack_ffffffffffffff2c;
    openBrace_00.kind = (short)uVar6;
    openBrace_00._2_1_ = (char)((uint)uVar6 >> 0x10);
    openBrace_00.numFlags.raw = (char)((uint)uVar6 >> 0x18);
    openBrace_00.info = pIVar2;
    closeBrace_00.rawLen._0_2_ = in_stack_ffffffffffffff1c;
    closeBrace_00.kind = (short)uVar4;
    closeBrace_00._2_1_ = (char)((uint)uVar4 >> 0x10);
    closeBrace_00.numFlags.raw = (char)((uint)uVar4 >> 0x18);
    closeBrace_00.rawLen._2_2_ = in_stack_ffffffffffffff1e;
    closeBrace_00.info = (Info *)_Var5._M_extent_value;
    local_10 = slang::syntax::SyntaxFactory::portConcatenation
                         ((SyntaxFactory *)CONCAT44(in_stack_ffffffffffffff14,uVar3),openBrace_00,
                          references,closeBrace_00);
  }
  else {
    local_10 = (PortConcatenationSyntax *)parsePortReference(in_stack_ffffffffffffff30);
  }
  return &local_10->super_PortExpressionSyntax;
}

Assistant:

PortExpressionSyntax& Parser::parsePortExpression() {
    if (peek(TokenKind::OpenBrace)) {
        Token openBrace, closeBrace;
        std::span<TokenOrSyntax> items;

        parseList<isIdentifierOrComma, isEndOfBracedList>(
            TokenKind::OpenBrace, TokenKind::CloseBrace, TokenKind::Comma, openBrace, items,
            closeBrace, RequireItems::True, diag::ExpectedExpression,
            [this] { return &parsePortReference(); });

        return factory.portConcatenation(openBrace, items, closeBrace);
    }
    return parsePortReference();
}